

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRVersionFromFile(EXRVersion *version,char *filename)

{
  size_t sVar1;
  char *in_RSI;
  EXRVersion *in_RDI;
  size_t ret;
  uchar buf [8];
  size_t file_size;
  FILE *fp;
  uchar local_30 [8];
  ulong local_28;
  FILE *local_20;
  EXRVersion *local_10;
  int local_4;
  
  if (in_RSI == (char *)0x0) {
    local_4 = -3;
  }
  else {
    local_20 = (FILE *)0x0;
    local_10 = in_RDI;
    local_20 = fopen(in_RSI,"rb");
    if (local_20 == (FILE *)0x0) {
      local_4 = -7;
    }
    else {
      fseek(local_20,0,2);
      local_28 = ftell(local_20);
      fseek(local_20,0,0);
      if (local_28 < 8) {
        local_4 = -5;
      }
      else {
        sVar1 = fread(local_30,1,8,local_20);
        fclose(local_20);
        if (sVar1 == 8) {
          local_4 = ParseEXRVersionFromMemory(local_10,local_30,8);
        }
        else {
          local_4 = -5;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ParseEXRVersionFromFile(EXRVersion *version, const char *filename) {
  if (filename == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t err = _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (err != 0) {
    // TODO(syoyo): return wfopen_s erro code
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t file_size;
  // Compute size
  fseek(fp, 0, SEEK_END);
  file_size = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  if (file_size < tinyexr::kEXRVersionSize) {
    return TINYEXR_ERROR_INVALID_FILE;
  }

  unsigned char buf[tinyexr::kEXRVersionSize];
  size_t ret = fread(&buf[0], 1, tinyexr::kEXRVersionSize, fp);
  fclose(fp);

  if (ret != tinyexr::kEXRVersionSize) {
    return TINYEXR_ERROR_INVALID_FILE;
  }

  return ParseEXRVersionFromMemory(version, buf, tinyexr::kEXRVersionSize);
}